

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O1

int testFileWriterTestsWriteDataWithOffset(void)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  unsigned_long size;
  SpanSize<18446744073709551615UL> __n;
  uchar *ptr;
  pointer __s1;
  pointer ptVar7;
  SpanSize<18446744073709551615UL> in_R8;
  pointer ptVar8;
  void *pvVar9;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  Span<unsigned_char,_18446744073709551615UL> data_00;
  Span<unsigned_char,_18446744073709551615UL> data_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  AutoDeleteTempFile tempfile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined4 local_284;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_280;
  AutoDeleteTempFile local_268;
  undefined1 local_240 [16];
  pointer local_230;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_268);
  local_240._0_4_ = 0x281e140a;
  __l._M_len = 4;
  __l._M_array = local_240;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_280,__l,(allocator_type *)&local_284);
  puVar2 = local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n.m_size = (long)local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  __s1 = (pointer)0x0;
  if (__n.m_size != 0) {
    __s1 = local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  }
  psVar5 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_268);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_240,psVar5,true);
  ptVar7 = (pointer)0x0;
  if (puVar2 != puVar1) {
    ptVar7 = puVar1;
  }
  data.m_size.m_size = __n.m_size;
  data.m_ptr = ptVar7;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_240,data,0x40);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_240);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,
             (long)local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&local_284);
  ptVar8 = (pointer)(local_240._8_8_ + -(long)CONCAT44(local_240._4_4_,local_240._0_4_));
  pvVar9 = (void *)0x0;
  if (ptVar8 != (pointer)0x0) {
    pvVar9 = (void *)CONCAT44(local_240._4_4_,local_240._0_4_);
  }
  psVar5 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_268);
  data_00.m_size.m_size = in_R8.m_size;
  data_00.m_ptr = ptVar8;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar5,(string *)0x40,(uint64_t)pvVar9,data_00);
  if ((pointer)__n.m_size == ptVar8) {
    if (puVar2 != puVar1) {
      iVar3 = bcmp(__s1,pvVar9,__n.m_size);
      if (iVar3 != 0) goto LAB_001c7635;
    }
    local_284 = 0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_280);
    psVar5 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_268);
    data_01.m_size.m_size = in_R8.m_size;
    data_01.m_ptr = ptVar8;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar5,(string *)0x0,(uint64_t)pvVar9,data_01);
    if ((pointer)__n.m_size == ptVar8) {
      iVar3 = 0;
      if (puVar2 == puVar1) goto LAB_001c77d5;
      iVar4 = bcmp(__s1,pvVar9,__n.m_size);
      iVar3 = 0;
      if (iVar4 == 0) goto LAB_001c77d5;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x79);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
LAB_001c7635:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  iVar3 = 1;
LAB_001c77d5:
  pvVar9 = (void *)CONCAT44(local_240._4_4_,local_240._0_4_);
  if (pvVar9 != (void *)0x0) {
    operator_delete(pvVar9,(long)local_230 - (long)pvVar9);
  }
  if (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_268);
  return iVar3;
}

Assistant:

int testFileWriterTestsWriteDataWithOffset()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 64;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Writer writes 0s if offset is out of current file boundry
        expected = {0, 0, 0, 0};
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    return 0;
}